

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
read_file_text(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
              string *file_name)

{
  int iVar1;
  FILE *f;
  uint32_t num;
  value_type local_44;
  string local_40;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_40,(string *)file_name);
  f = fopen_or_fail(&local_40,"r");
  std::__cxx11::string::~string((string *)&local_40);
  while( true ) {
    iVar1 = __isoc99_fscanf(f,"%u\n",&local_44);
    if (iVar1 != 1) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_44);
  }
  fclose_or_fail(f);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> read_file_text(std::string file_name)
{
    std::vector<uint32_t> content;
    auto fd = fopen_or_fail(file_name, "r");
    uint32_t num;
    while (fscanf(fd, "%u\n", &num) == 1) {
        content.push_back(num);
    }
    fclose_or_fail(fd);
    return content;
}